

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

GlobalStateInfo
Fossilize::Hashing::parse_global_state_info
          (VkGraphicsPipelineCreateInfo *create_info,DynamicStateInfo *dynamic_info,
          SubpassMeta *meta)

{
  int iVar1;
  VkPipelineRasterizationStateCreateInfo *pVVar2;
  VkGraphicsPipelineLibraryFlagsEXT VVar3;
  ulong uVar4;
  uint3 uVar6;
  ulong uVar5;
  uint uVar7;
  uint3 uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  GlobalStateInfo GVar19;
  
  VVar3 = graphics_pipeline_get_effective_state_flags
                    ((Fossilize *)create_info,(VkGraphicsPipelineCreateInfo *)dynamic_info);
  pVVar2 = create_info->pRasterizationState;
  if ((((dynamic_info->rasterizer_discard_enable == false) &&
       (pVVar2 != (VkPipelineRasterizationStateCreateInfo *)0x0)) && ((VVar3 & 2) != 0)) &&
     (pVVar2->rasterizerDiscardEnable == 1)) {
    uVar10 = 0;
    uVar11 = 0;
    uVar9 = 0;
    uVar5 = 0;
  }
  else {
    uVar10 = (ulong)meta->uses_color << 0x28;
    if (create_info->pColorBlendState == (VkPipelineColorBlendStateCreateInfo *)0x0) {
      uVar10 = 0;
    }
    uVar11 = (ulong)meta->uses_depth_stencil << 0x20;
    if (create_info->pDepthStencilState == (VkPipelineDepthStencilStateCreateInfo *)0x0) {
      uVar11 = 0;
    }
    uVar9 = (ulong)(create_info->pMultisampleState != (VkPipelineMultisampleStateCreateInfo *)0x0)
            << 0x18;
    uVar5 = (ulong)(create_info->pViewportState != (VkPipelineViewportStateCreateInfo *)0x0) << 0x10
    ;
  }
  bVar17 = create_info->pInputAssemblyState != (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  uVar15 = 0;
  uVar13 = (ulong)(dynamic_info->vertex_input ^ 1);
  if (create_info->pVertexInputState == (VkPipelineVertexInputStateCreateInfo *)0x0) {
    uVar13 = uVar15;
  }
  bVar12 = (byte)uVar13;
  if ((VVar3 & 6) == 0) {
    uVar8 = 1;
  }
  else {
    bVar18 = false;
    for (lVar16 = 0; bVar12 = (byte)uVar13, (ulong)create_info->stageCount * 0x30 - lVar16 != 0;
        lVar16 = lVar16 + 0x30) {
      iVar1 = *(int *)((long)&create_info->pStages->stage + lVar16);
      if (iVar1 == 2) {
LAB_0013f8ea:
        bVar18 = create_info->pTessellationState != (VkPipelineTessellationStateCreateInfo *)0x0;
      }
      else if ((iVar1 == 0x80) || (iVar1 == 0x40)) {
        uVar13 = 0;
        bVar17 = false;
      }
      else if (iVar1 == 4) goto LAB_0013f8ea;
    }
    uVar15 = (ulong)bVar18 << 8;
    uVar8 = 0x10101;
  }
  uVar7 = VVar3 >> 1 & 1;
  uVar6 = uVar8 & 0x10100;
  if ((VVar3 & 0xe) != 0) {
    uVar6 = uVar8;
  }
  uVar13 = 0;
  if ((VVar3 & 8) == 0) {
    uVar10 = uVar13;
  }
  if ((VVar3 & 4) == 0) {
    uVar11 = uVar13;
  }
  if ((VVar3 & 0xc) == 0) {
    uVar9 = uVar13;
  }
  if (uVar7 == 0) {
    uVar15 = uVar13;
    uVar5 = uVar13;
  }
  bVar18 = (VVar3 & 1) == 0;
  uVar14 = (ulong)bVar12 << 0x30;
  if (bVar18) {
    uVar14 = uVar13;
  }
  uVar4 = (ulong)bVar17;
  if (bVar18) {
    uVar4 = uVar13;
  }
  GVar19._0_8_ = uVar4 | uVar15 |
                 uVar14 | uVar5 |
                 uVar11 | uVar10 | uVar9 |
                 (ulong)(pVVar2 != (VkPipelineRasterizationStateCreateInfo *)0x0 & (byte)uVar7) <<
                 0x38;
  GVar19.render_pass_state = (bool)(char)uVar6;
  GVar19.layout_state = (bool)(char)(uVar6 >> 8);
  GVar19.module_state = (bool)(char)(uVar6 >> 0x10);
  return GVar19;
}

Assistant:

static GlobalStateInfo parse_global_state_info(const VkGraphicsPipelineCreateInfo &create_info,
                                               const DynamicStateInfo &dynamic_info,
                                               const StateRecorder::SubpassMeta &meta)
{
	GlobalStateInfo info = {};

	info.rasterization_state = create_info.pRasterizationState != nullptr;
	info.render_pass_state = true;
	info.module_state = true;
	info.layout_state = true;

	auto state_flags = graphics_pipeline_get_effective_state_flags(create_info);

	info.rasterization_state = create_info.pRasterizationState &&
	                           (state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT) != 0;

	bool rasterizer_discard = !dynamic_info.rasterizer_discard_enable &&
	                          info.rasterization_state &&
	                          create_info.pRasterizationState->rasterizerDiscardEnable == VK_TRUE;

	if (!rasterizer_discard)
	{
		info.viewport_state = create_info.pViewportState != nullptr;
		info.multisample_state = create_info.pMultisampleState != nullptr;
		info.color_blend_state = create_info.pColorBlendState != nullptr && meta.uses_color;
		info.depth_stencil_state = create_info.pDepthStencilState != nullptr && meta.uses_depth_stencil;
	}

	info.input_assembly = create_info.pInputAssemblyState != nullptr;
	info.vertex_input = create_info.pVertexInputState != nullptr && !dynamic_info.vertex_input;

	info.module_state = graphics_pipeline_library_state_flags_have_module_state(state_flags);
	info.layout_state = info.module_state;

	if (info.module_state)
	{
		for (uint32_t i = 0; i < create_info.stageCount; i++)
		{
			switch (create_info.pStages[i].stage)
			{
			case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
			case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
				info.tessellation_state = create_info.pTessellationState != nullptr;
				break;

			case VK_SHADER_STAGE_MESH_BIT_EXT:
			case VK_SHADER_STAGE_TASK_BIT_EXT:
				info.input_assembly = false;
				info.vertex_input = false;
				break;

			default:
				break;
			}
		}
	}

	// If state is not part of the interface for a pipeline library, nop out that state explicitly.
	if ((state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_VERTEX_INPUT_INTERFACE_BIT_EXT) == 0)
	{
		info.input_assembly = false;
		info.vertex_input = false;
	}

	if ((state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT) == 0)
	{
		info.viewport_state = false;
		info.rasterization_state = false;
		info.tessellation_state = false;
	}

	if ((state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT) == 0)
	{
		info.depth_stencil_state = false;
	}

	if ((state_flags & (
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT)) == 0)
	{
		info.multisample_state = false;
	}

	if ((state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT) == 0)
		info.color_blend_state = false;

	// We can ignore formats for dynamic rendering if output interface isn't used, but that's too esoteric.
	// We're mostly interested in ignoring pointers which could be garbage.
	if ((state_flags & (
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT)) == 0)
	{
		info.render_pass_state = false;
	}

	return info;
}